

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_>::Data
          (Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *this,
          Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  QMakeBaseKey *pQVar4;
  long in_RSI;
  Span<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  Node<QMakeBaseKey,_QMakeBaseEnv_*> *newNode;
  Node<QMakeBaseKey,_QMakeBaseEnv_*> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *this_00;
  QMakeBaseKey *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  QMakeBaseKey *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  (((QMakeBaseKey *)in_RDI->offsets)->root).d.ptr = *(char16_t **)(in_RSI + 8);
  (((QMakeBaseKey *)in_RDI->offsets)->root).d.size = 0;
  (((QMakeBaseKey *)in_RDI->offsets)->stash).d.d = *(Data **)(in_RSI + 0x18);
  (((QMakeBaseKey *)in_RDI->offsets)->stash).d.ptr = (char16_t *)0x0;
  qMax<unsigned_long>((unsigned_long *)&(((QMakeBaseKey *)in_RDI->offsets)->root).d.ptr,&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  (((QMakeBaseKey *)in_RDI->offsets)->root).d.size = sVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  (((QMakeBaseKey *)in_RDI->offsets)->stash).d.ptr = (char16_t *)RVar5.spans;
  pQVar4 = (QMakeBaseKey *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = pQVar4;
  for (local_40 = (QMakeBaseKey *)0x0; local_40 < pQVar4;
      local_40 = (QMakeBaseKey *)((long)&(local_40->root).d.d + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_>::hasNode
                        ((Span<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_>::at(this_00,(size_t)in_RDI);
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18 = findBucket<QMakeBaseKey>
                             ((Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *)RVar5.spans
                              ,key);
        Bucket::insert((Bucket *)0x306127);
        Node<QMakeBaseKey,_QMakeBaseEnv_*>::Node
                  ((Node<QMakeBaseKey,_QMakeBaseEnv_*> *)this_00,
                   (Node<QMakeBaseKey,_QMakeBaseEnv_*> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }